

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O3

size_t xemmai::t_type_of<xemmai::t_tuple>::f_do_get_at(t_object *a_this,t_pvalue *a_stack)

{
  t_object *ptVar1;
  t_object *p;
  long lVar2;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar3;
  wstring_view a_message;
  
  ptVar1 = a_stack[2].super_t_pointer.v_p;
  if ((ptVar1 == (t_object *)0x3) ||
     (((((t_object *)0x2 < ptVar1 && (ptVar1 != (t_object *)0x4)) && (ptVar1->v_type->v_depth != 0))
      && ((undefined8 *)ptVar1->v_type->v_ids[1] == &v__type_id<long>)))) {
    paVar3 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar3 = &a_stack[2].field_0;
    }
    if ((ulong)paVar3->v_integer < *(ulong *)a_this->v_data) {
      lVar2 = paVar3->v_integer * 0x10;
      (a_stack->super_t_pointer).v_p = *(t_object **)(a_this->v_data + lVar2 + 8);
      a_stack->field_0 =
           *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
            (a_this->v_data + lVar2 + 0x10);
      return 0xffffffffffffffff;
    }
  }
  else {
    f_do_get_at();
    paVar3 = extraout_RDX;
  }
  a_message._M_str = (wchar_t *)paVar3;
  a_message._M_len = (size_t)L"out of range.";
  f_throw((xemmai *)0xd,a_message);
}

Assistant:

size_t t_type_of<t_tuple>::f_do_get_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<size_t>(a_stack[2], L"index");
	a_stack[0] = a_this->f_as<t_tuple>().f_get_at(f_as<size_t>(a_stack[2]));
	return -1;
}